

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STGV.cpp
# Opt level: O2

void __thiscall STGV::visit(STGV *this,VarDecl *node)

{
  Class *this_00;
  Variable *this_01;
  mapped_type *ppCVar1;
  string *varName;
  
  this_01 = createVar(&node->super_ASTNode);
  this_01->kind = VAR;
  ppCVar1 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)this->symbolTable,&this->currentNamespace);
  this_00 = *ppCVar1;
  varName = Variable::getName_abi_cxx11_(this_01);
  Class::addVariable(this_00,varName,this_01);
  return;
}

Assistant:

void STGV::visit(VarDecl *node) {
    Variable *variable = createVar(node);
    variable->setKind(Enums::Kind::VAR);
    try { symbolTable->classes.at(currentNamespace)->addVariable(variable->getName(), variable); }
    catch (Semantic::Error &error) {
        detector->addError(error.what());
        return;
    }
}